

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fad.h
# Opt level: O1

Fad<double> * __thiscall
Fad<double>::operator=
          (Fad<double> *this,
          FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadFuncAtan<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>_>_>_>_>_>_>
          *fadexpr)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  FadExpr<FadFuncAtan<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>_>_>_>_>
  *pFVar4;
  FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *pFVar5;
  FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_> *pFVar6;
  bool bVar7;
  double *pdVar8;
  uint uVar9;
  ulong uVar10;
  value_type vVar11;
  
  pFVar4 = (fadexpr->fadexpr_).right_;
  uVar1 = (((fadexpr->fadexpr_).left_)->dx_).num_elts;
  pFVar5 = (pFVar4->fadexpr_).expr_.fadexpr_.left_;
  uVar2 = (((pFVar5->fadexpr_).left_)->dx_).num_elts;
  uVar3 = (((pFVar5->fadexpr_).right_)->dx_).num_elts;
  if ((int)uVar3 < (int)uVar2) {
    uVar3 = uVar2;
  }
  pFVar6 = (pFVar4->fadexpr_).expr_.fadexpr_.right_;
  uVar2 = (((pFVar6->fadexpr_).left_)->dx_).num_elts;
  uVar9 = (((pFVar6->fadexpr_).right_)->dx_).num_elts;
  if ((int)uVar9 < (int)uVar2) {
    uVar9 = uVar2;
  }
  if ((int)uVar9 < (int)uVar3) {
    uVar9 = uVar3;
  }
  if ((int)uVar9 < (int)uVar1) {
    uVar9 = uVar1;
  }
  uVar1 = (this->dx_).num_elts;
  if (uVar9 != uVar1) {
    if (uVar9 == 0) {
      if (uVar1 != 0) {
        pdVar8 = (this->dx_).ptr_to_data;
        if (pdVar8 != (double *)0x0) {
          operator_delete__(pdVar8);
        }
        (this->dx_).num_elts = 0;
        (this->dx_).ptr_to_data = (double *)0x0;
      }
    }
    else {
      if (uVar1 != 0) {
        pdVar8 = (this->dx_).ptr_to_data;
        if (pdVar8 != (double *)0x0) {
          operator_delete__(pdVar8);
        }
        (this->dx_).num_elts = 0;
        (this->dx_).ptr_to_data = (double *)0x0;
      }
      (this->dx_).num_elts = uVar9;
      uVar10 = 0xffffffffffffffff;
      if (-1 < (int)uVar9) {
        uVar10 = (long)(int)uVar9 << 3;
      }
      pdVar8 = (double *)operator_new__(uVar10);
      (this->dx_).ptr_to_data = pdVar8;
    }
  }
  if (uVar9 != 0) {
    pdVar8 = (this->dx_).ptr_to_data;
    if (((((fadexpr->fadexpr_).left_)->dx_).num_elts == 0) ||
       (bVar7 = FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>_>
                ::hasFastAccess((FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>_>
                                 *)&((fadexpr->fadexpr_).right_)->fadexpr_), !bVar7)) {
      if (0 < (int)uVar9) {
        uVar10 = 0;
        do {
          vVar11 = FadBinaryMul<Fad<double>,_FadExpr<FadFuncAtan<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>_>_>_>_>_>
                   ::dx(&fadexpr->fadexpr_,(int)uVar10);
          pdVar8[uVar10] = vVar11;
          uVar10 = uVar10 + 1;
        } while (uVar9 != uVar10);
      }
    }
    else if (0 < (int)uVar9) {
      uVar10 = 0;
      do {
        vVar11 = FadBinaryMul<Fad<double>,_FadExpr<FadFuncAtan<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>_>_>_>_>_>
                 ::fastAccessDx(&fadexpr->fadexpr_,(int)uVar10);
        pdVar8[uVar10] = vVar11;
        uVar10 = uVar10 + 1;
      } while (uVar9 != uVar10);
    }
  }
  vVar11 = FadBinaryMul<Fad<double>,_FadExpr<FadFuncAtan<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>_>_>_>_>_>
           ::val(&fadexpr->fadexpr_);
  this->val_ = vVar11;
  return this;
}

Assistant:

inline Fad<T> & Fad<T>::operator=(const FadExpr<ExprT>& fadexpr) 
{
  int sz = fadexpr.size();

  if ( sz != dx_.size() ) dx_.resize(sz);

  if ( sz ) {
    T* RESTRICT dxp = dx_.begin();
    if (fadexpr.hasFastAccess())
      for(int i=0; i<sz; ++i)
	dxp[i] = fadexpr.fastAccessDx(i);
    else
      for(int i=0; i<sz; ++i)
	dxp[i] = fadexpr.dx(i);
  }
  
  val_ = fadexpr.val();
  
  return *this;
}